

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  SymbolKind *pSVar2;
  value_type_pointer ppVar3;
  pointer ppUVar4;
  value_type_pointer ppVar5;
  Compilation *pCVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar8;
  UdpBodySyntax *pUVar9;
  long lVar10;
  UdpInitialStmtSyntax *this;
  UdpEntrySyntax *syntax_00;
  UdpFieldBaseSyntax *pUVar11;
  int *piVar12;
  size_t sVar13;
  string_view sVar14;
  string_view sVar15;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 uVar20;
  uchar uVar21;
  span<const_char,_18446744073709551615UL> inputs;
  span<const_char,_18446744073709551615UL> inputs_00;
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  basic_string_view<char,_std::char_traits<char>_> *pbVar25;
  UdpPortDeclSyntax *pUVar26;
  pointer ppUVar27;
  size_type sVar28;
  undefined8 uVar29;
  pointer ppPVar30;
  bool bVar31;
  logic_t lVar32;
  logic_t lVar33;
  byte bVar35;
  int iVar36;
  bitwidth_t bVar37;
  PrimitivePortSymbol *this_00;
  SyntaxNode *pSVar41;
  byte *pbVar42;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar43;
  PrimitivePortSymbol *pPVar44;
  ulong uVar45;
  uint64_t uVar46;
  ulong uVar47;
  undefined4 extraout_var;
  Diagnostic *pDVar48;
  SourceLocation SVar49;
  Expression *pEVar50;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  byte bVar34;
  uint uVar38;
  uint uVar39;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var51;
  size_t sVar52;
  uint uVar53;
  uint uVar54;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *pEVar55;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  EVP_PKEY_CTX *extraout_RDX_17;
  size_t extraout_RDX_18;
  size_type sVar56;
  EVP_PKEY_CTX *extraout_RDX_19;
  EVP_PKEY_CTX *extraout_RDX_20;
  EVP_PKEY_CTX *extraout_RDX_21;
  EVP_PKEY_CTX *extraout_RDX_22;
  EVP_PKEY_CTX *extraout_RDX_23;
  EVP_PKEY_CTX *extraout_RDX_24;
  EVP_PKEY_CTX *pEVar57;
  EVP_PKEY_CTX *extraout_RDX_25;
  EVP_PKEY_CTX *extraout_RDX_26;
  char *extraout_RDX_27;
  EVP_PKEY_CTX *extraout_RDX_28;
  EVP_PKEY_CTX *extraout_RDX_29;
  EVP_PKEY_CTX *extraout_RDX_30;
  PrimitivePortSymbol *extraout_RDX_31;
  EVP_PKEY_CTX *extraout_RDX_32;
  EVP_PKEY_CTX *extraout_RDX_33;
  EVP_PKEY_CTX *extraout_RDX_34;
  unsigned_long extraout_RDX_35;
  EVP_PKEY_CTX *extraout_RDX_36;
  EVP_PKEY_CTX *extraout_RDX_37;
  EVP_PKEY_CTX *extraout_RDX_38;
  UdpOutputPortDeclSyntax *outputDecl;
  ValueDriver *pVVar58;
  SyntaxNode *pSVar59;
  size_type sVar60;
  long lVar61;
  size_t sVar62;
  size_t sVar63;
  DiagCode code;
  long lVar64;
  Symbol *pSVar65;
  Symbol *pos0;
  group_type_pointer pgVar66;
  char cVar67;
  difference_type __len;
  ulong uVar68;
  byte bVar69;
  DeclaredType *this_02;
  ValueDriver *pVVar70;
  value_type *pvVar71;
  byte bVar72;
  size_type __rlen;
  ulong uVar73;
  pointer ppUVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  SourceRange SVar79;
  string_view sVar80;
  string_view sVar81;
  UdpInputPortDeclSyntax *inputDecl_1;
  value_type *elements_1;
  size_t pos;
  uchar local_318;
  uchar uStack_317;
  uchar uStack_316;
  uchar uStack_315;
  PrimitivePortSymbol *port_2;
  char *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  PrimitivePortSymbol *port_1;
  uint uStack_2d0;
  bool bStack_2cc;
  bool bStack_2cb;
  undefined2 uStack_2ca;
  undefined1 local_2c8 [56];
  UdpInputPortDeclSyntax *local_290;
  Symbol *local_288;
  value_type *elements;
  SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> conflicts;
  PrimitivePortSymbol *port;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 local_200 [56];
  PrimitivePortDirection local_1c8 [4];
  string_view primName;
  Token name;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> local_140 [8];
  arrays_type local_138;
  undefined8 local_118;
  long lStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> trieAlloc;
  BumpAllocator alloc;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  uint uVar40;
  undefined4 extraout_var_00;
  
  pCVar6 = scope->compilation;
  primName = parsing::Token::valueText(&syntax->name);
  name._0_8_ = parsing::Token::location(&syntax->name);
  auVar23._12_4_ = 0;
  auVar23._0_12_ = stack0xfffffffffffffdec;
  _port = auVar23 << 0x20;
  this_00 = (PrimitivePortSymbol *)
            BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&pCVar6->super_BumpAllocator,pCVar6,&primName,(SourceLocation *)&name,
                       (PrimitiveKind *)&port);
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes((Symbol *)this_00,scope,syntax_01);
  (this_00->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  pSVar59 = &((syntax->portList).ptr)->super_SyntaxNode;
  pEVar57 = extraout_RDX;
  local_200._48_8_ = syntax;
  if (pSVar59->kind == WildcardUdpPortList) {
    pSVar41 = Compilation::getExternDefinition(pCVar6,primName,scope);
    if ((pSVar41 == (SyntaxNode *)0x0) || (pSVar41->kind != ExternUdpDecl)) {
      SVar79 = slang::syntax::SyntaxNode::sourceRange(pSVar59);
      pDVar48 = Scope::addDiag(scope,(DiagCode)0x7d0006,SVar79);
      Diagnostic::operator<<(pDVar48,primName);
      pEVar57 = extraout_RDX_01;
    }
    else {
      pSVar59 = pSVar41[7].previewNode;
      pEVar57 = extraout_RDX_00;
    }
  }
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ =
       (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len = 0;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.cap = 5;
  if (pSVar59->kind == NonAnsiUdpPortList) {
    local_138.groups_size_index = 0x3f;
    local_138.groups_size_mask = 1;
    local_138._16_16_ = ZEXT816(0x48f470);
    _local_118 = (undefined1  [16])0x0;
    pbVar42 = (byte *)((long)&(pSVar59[3].previewNode)->kind + 1);
    local_140 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>  [8])&name;
    if ((byte *)0x1 < pbVar42) {
      uVar73 = 0;
      do {
        ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (pSVar59[3].parent + uVar73 * 2));
        port_1 = *(PrimitivePortSymbol **)(*ppSVar43 + 1);
        pSVar41 = (*ppSVar43)[1].parent;
        uStack_2d0 = (uint)pSVar41;
        bStack_2cc = SUB81((ulong)pSVar41 >> 0x20,0);
        bStack_2cb = SUB81((ulong)pSVar41 >> 0x28,0);
        uStack_2ca = (undefined2)((ulong)pSVar41 >> 0x30);
        _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
        SVar49 = parsing::Token::location((Token *)&port_1);
        conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
             (pointer)SVar49;
        local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
        port_2 = BumpAllocator::
                 emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                           (&pCVar6->super_BumpAllocator,pCVar6,
                            (basic_string_view<char,_std::char_traits<char>_> *)&port,
                            (SourceLocation *)&conflicts,local_1c8);
        SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
        emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_2);
        Scope::insertMember((Scope *)&(this_00->super_ValueSymbol).declaredType,(Symbol *)port_2,
                            (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,false,
                            true);
        sVar80 = parsing::Token::valueText((Token *)&port_1);
        pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
        if (sVar80._M_len != 0) {
          conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>._0_16_ =
               parsing::Token::valueText((Token *)&port_1);
          uVar46 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (local_140,
                              (basic_string_view<char,_std::char_traits<char>_> *)&conflicts);
          pSVar65 = (Symbol *)(uVar46 >> ((undefined1)local_138.groups_size_index & 0x3f));
          lVar64 = (uVar46 & 0xff) * 4;
          uVar17 = (&UNK_0048f58c)[lVar64];
          uVar18 = (&UNK_0048f58d)[lVar64];
          uVar19 = (&UNK_0048f58e)[lVar64];
          bVar35 = (&UNK_0048f58f)[lVar64];
          pvVar71 = (value_type *)0x0;
          pos0 = pSVar65;
          do {
            pgVar66 = (group_type_pointer)((long)local_138.groups_ + (long)pSVar65 * 0x10);
            bVar34 = pgVar66->m[0xf].n;
            auVar77[0] = -(pgVar66->m[0].n == uVar17);
            auVar77[1] = -(pgVar66->m[1].n == uVar18);
            auVar77[2] = -(pgVar66->m[2].n == uVar19);
            auVar77[3] = -(pgVar66->m[3].n == bVar35);
            auVar77[4] = -(pgVar66->m[4].n == uVar17);
            auVar77[5] = -(pgVar66->m[5].n == uVar18);
            auVar77[6] = -(pgVar66->m[6].n == uVar19);
            auVar77[7] = -(pgVar66->m[7].n == bVar35);
            auVar77[8] = -(pgVar66->m[8].n == uVar17);
            auVar77[9] = -(pgVar66->m[9].n == uVar18);
            auVar77[10] = -(pgVar66->m[10].n == uVar19);
            auVar77[0xb] = -(pgVar66->m[0xb].n == bVar35);
            auVar77[0xc] = -(pgVar66->m[0xc].n == uVar17);
            auVar77[0xd] = -(pgVar66->m[0xd].n == uVar18);
            auVar77[0xe] = -(pgVar66->m[0xe].n == uVar19);
            auVar77[0xf] = -(bVar34 == bVar35);
            uVar38 = (uint)(ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe);
            if (uVar38 != 0) {
              pgVar66 = (group_type_pointer)((long)local_138.groups_ + (long)pSVar65 * 0x10);
              ppVar3 = (value_type_pointer)((long)local_138.elements_ + (long)pSVar65 * 0x168);
              local_288 = pos0;
              elements = pvVar71;
              do {
                uVar53 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                bVar31 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)local_140,
                                    (basic_string_view<char,_std::char_traits<char>_> *)&conflicts,
                                    &ppVar3[uVar53].first);
                pEVar57 = extraout_RDX_13;
                if (bVar31) goto LAB_0024bf18;
                uVar38 = uVar38 - 1 & uVar38;
              } while (uVar38 != 0);
              bVar34 = pgVar66->m[0xf].n;
              pvVar71 = elements;
              pos0 = local_288;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar46 & 7] & bVar34) == 0) break;
            pbVar25 = &pvVar71->first;
            pvVar71 = (value_type *)((long)&(pvVar71->first)._M_len + 1);
            pSVar65 = (Symbol *)
                      ((ulong)((byte *)((long)&pSVar65->kind + 1) + (long)&pbVar25->_M_len) &
                      local_138.groups_size_mask);
          } while (pvVar71 <= local_138.groups_size_mask);
          if ((ulong)lStack_110 < (ulong)local_118) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                      ((locator *)&port,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                        *)local_140,&local_138,(size_t)pos0,uVar46,(try_emplace_args_t *)local_1c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)&conflicts,&port_2);
            lStack_110 = lStack_110 + 1;
            pEVar57 = extraout_RDX_14;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                      ((locator *)&port,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                        *)local_140,uVar46,(try_emplace_args_t *)local_1c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)&conflicts,&port_2);
            pEVar57 = extraout_RDX_15;
          }
        }
LAB_0024bf18:
        uVar73 = uVar73 + 1;
      } while (uVar73 != (ulong)pbVar42 >> 1);
    }
    local_108 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_200._48_8_ + 0x78))->ptr;
    uVar73 = (((UdpBodySyntax *)local_108)->portDecls).elements._M_extent._M_extent_value + 1;
    if (1 < uVar73) {
      local_290 = (UdpInputPortDeclSyntax *)0x0;
      uVar68 = 0;
      do {
        ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                               (local_108 + 0x40))->_M_ptr + uVar68 * 2));
        inputDecl_1 = (UdpInputPortDeclSyntax *)*ppSVar43;
        if ((inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind == UdpOutputPortDecl) {
          port_1 = (PrimitivePortSymbol *)
                   (inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode.parent;
          pSVar59 = (inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
          uStack_2d0 = (uint)pSVar59;
          bStack_2cc = SUB81((ulong)pSVar59 >> 0x20,0);
          bStack_2cb = SUB81((ulong)pSVar59 >> 0x28,0);
          uStack_2ca = (undefined2)((ulong)pSVar59 >> 0x30);
          _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
          uVar46 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (local_140,(basic_string_view<char,_std::char_traits<char>_> *)&port);
          sVar62 = local_138.groups_size_mask;
          pEVar55 = (EVP_PKEY_CTX *)(uVar46 >> ((undefined1)local_138.groups_size_index & 0x3f));
          lVar64 = (uVar46 & 0xff) * 4;
          uVar20 = (&UNK_0048f58c)[lVar64];
          bVar35 = (&UNK_0048f58d)[lVar64];
          bVar34 = (&UNK_0048f58e)[lVar64];
          bVar69 = (&UNK_0048f58f)[lVar64];
          ppVar3 = local_138.elements_;
          pPVar44 = port;
          uVar29 = uStack_210;
          pvVar71 = (value_type *)0x0;
          local_288 = (Symbol *)local_138.groups_;
          do {
            pSVar2 = &local_288->kind + (long)pEVar55 * 4;
            auVar76[0] = -((char)*pSVar2 == uVar20);
            auVar76[1] = -(*(byte *)((long)pSVar2 + 1) == bVar35);
            auVar76[2] = -(*(byte *)((long)pSVar2 + 2) == bVar34);
            auVar76[3] = -(*(byte *)((long)pSVar2 + 3) == bVar69);
            auVar76[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar20);
            auVar76[5] = -(*(char *)((long)pSVar2 + 5) == bVar35);
            auVar76[6] = -(*(char *)((long)pSVar2 + 6) == bVar34);
            auVar76[7] = -(*(char *)((long)pSVar2 + 7) == bVar69);
            auVar76[8] = -((char)((string_view *)(pSVar2 + 2))->_M_len == uVar20);
            auVar76[9] = -(*(char *)((long)pSVar2 + 9) == bVar35);
            auVar76[10] = -(*(char *)((long)pSVar2 + 10) == bVar34);
            auVar76[0xb] = -(*(char *)((long)pSVar2 + 0xb) == bVar69);
            auVar76[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar20);
            auVar76[0xd] = -(*(char *)((long)pSVar2 + 0xd) == bVar35);
            auVar76[0xe] = -(*(char *)((long)pSVar2 + 0xe) == bVar34);
            auVar76[0xf] = -(*(char *)((long)pSVar2 + 0xf) == bVar69);
            elements = (value_type *)CONCAT71(elements._1_7_,*(char *)((long)pSVar2 + 0xf));
            uVar38 = (uint)(ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe);
            if (uVar38 != 0) {
              ppVar5 = (value_type_pointer)((long)ppVar3 + (long)pEVar55 * 0x168);
              pEVar57 = pEVar55;
              do {
                uVar53 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                if ((pPVar44 == (PrimitivePortSymbol *)ppVar5[uVar53].first._M_len) &&
                   ((pPVar44 == (PrimitivePortSymbol *)0x0 ||
                    (iVar36 = bcmp((void *)uVar29,ppVar5[uVar53].first._M_str,(size_t)pPVar44),
                    pEVar57 = extraout_RDX_09, iVar36 == 0)))) {
                  lVar64 = *(long *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode;
                  if ((lVar64 == 0) || ((inputDecl_1->keyword).info != (Info *)0x0)) {
                    pPVar44 = ppVar5[uVar53].second;
                    uStack_210._4_1_ = bStack_2cc;
                    uStack_210._0_4_ = uStack_2d0;
                    uStack_210._5_1_ = bStack_2cb;
                    uStack_210._6_2_ = uStack_2ca;
                    port = port_1;
                    if ((pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax !=
                        (SyntaxNode *)0x0) {
                      SVar79 = parsing::Token::range((Token *)&port);
                      pDVar48 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar79);
                      sVar80 = parsing::Token::valueText((Token *)&port);
                      Diagnostic::operator<<(pDVar48,sVar80);
                      Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,
                                          (pPVar44->super_ValueSymbol).super_Symbol.location);
                      lVar64 = *(long *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode;
                    }
                    pPVar44->direction = OutReg - (lVar64 == 0);
                    SVar49 = parsing::Token::location((Token *)&port_1);
                    (pPVar44->super_ValueSymbol).super_Symbol.location = SVar49;
                    (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax =
                         (SyntaxNode *)inputDecl_1;
                    syntax_03._M_ptr =
                         (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_ptr;
                    syntax_03._M_extent._M_extent_value =
                         (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_extent._M_extent_value;
                    Symbol::setAttributes((Symbol *)pPVar44,scope,syntax_03);
                    inputDecl_1 = local_290;
                    pEVar57 = extraout_RDX_11;
                  }
                  else if (local_290 != (UdpInputPortDeclSyntax *)0x0) {
                    SVar79 = parsing::Token::range((Token *)&inputDecl_1->names);
                    pDVar48 = Scope::addDiag(scope,(DiagCode)0xac0006,SVar79);
                    SVar49 = parsing::Token::location((Token *)&local_290->names);
                    Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,SVar49);
                    pEVar57 = extraout_RDX_12;
                  }
                  goto LAB_0024be29;
                }
                uVar38 = uVar38 - 1 & uVar38;
              } while (uVar38 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar46 & 7] & (byte)elements) == 0
               ) break;
            pEVar55 = pEVar55 + (long)pvVar71;
            pvVar71 = (value_type *)((long)&(pvVar71->first)._M_len + 1);
            pEVar55 = (EVP_PKEY_CTX *)((ulong)(pEVar55 + 1) & sVar62);
          } while (pvVar71 <= sVar62);
          sVar80 = parsing::Token::valueText((Token *)&port_1);
          pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
          if (sVar80._M_len == 0) {
            inputDecl_1 = local_290;
          }
          else {
            SVar79 = parsing::Token::range((Token *)&port_1);
            pDVar48 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar79);
            sVar80 = parsing::Token::valueText((Token *)&port_1);
            Diagnostic::operator<<(pDVar48,sVar80);
            inputDecl_1 = local_290;
            pEVar57 = extraout_RDX_10;
          }
LAB_0024be29:
          local_290 = inputDecl_1;
        }
        else {
          uVar45 = (inputDecl_1->names).elements._M_extent._M_extent_value + 1;
          pEVar57 = extraout_RDX_06;
          if (1 < uVar45) {
            local_f8 = uVar45 >> 1;
            pVVar58 = (ValueDriver *)0x0;
            do {
              ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((inputDecl_1->names).elements._M_ptr + (long)pVVar58 * 2));
              local_f0 = *ppSVar43;
              port_1 = *(PrimitivePortSymbol **)&((ValueDriver *)local_f0)->flags;
              pEVar50 = (((ValueDriver *)(local_f0 + 0x20))->prefixExpression).ptr;
              uStack_2d0 = (uint)pEVar50;
              bStack_2cc = SUB81((ulong)pEVar50 >> 0x20,0);
              bStack_2cb = SUB81((ulong)pEVar50 >> 0x28,0);
              uStack_2ca = (undefined2)((ulong)pEVar50 >> 0x30);
              _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
              uVar46 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (local_140,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&port);
              uVar45 = uVar46 >> ((undefined1)local_138.groups_size_index & 0x3f);
              pgVar66 = local_138.groups_;
              lVar64 = (uVar46 & 0xff) * 4;
              uVar17 = (&UNK_0048f58c)[lVar64];
              uVar18 = (&UNK_0048f58d)[lVar64];
              uVar19 = (&UNK_0048f58e)[lVar64];
              uVar21 = (&UNK_0048f58f)[lVar64];
              elements = local_138.elements_;
              pPVar44 = port;
              uVar29 = uStack_210;
              local_100 = local_138.groups_size_mask;
              pVVar70 = (ValueDriver *)0x0;
              do {
                pvVar71 = elements;
                pgVar1 = (group_type_pointer)((long)pgVar66 + uVar45 * 0x10);
                uVar16 = pgVar1->m[0xf].n;
                auVar75[0] = -(pgVar1->m[0].n == uVar17);
                auVar75[1] = -(pgVar1->m[1].n == uVar18);
                auVar75[2] = -(pgVar1->m[2].n == uVar19);
                auVar75[3] = -(pgVar1->m[3].n == uVar21);
                auVar75[4] = -(pgVar1->m[4].n == uVar17);
                auVar75[5] = -(pgVar1->m[5].n == uVar18);
                auVar75[6] = -(pgVar1->m[6].n == uVar19);
                auVar75[7] = -(pgVar1->m[7].n == uVar21);
                auVar75[8] = -(pgVar1->m[8].n == uVar17);
                auVar75[9] = -(pgVar1->m[9].n == uVar18);
                auVar75[10] = -(pgVar1->m[10].n == uVar19);
                auVar75[0xb] = -(pgVar1->m[0xb].n == uVar21);
                auVar75[0xc] = -(pgVar1->m[0xc].n == uVar17);
                auVar75[0xd] = -(pgVar1->m[0xd].n == uVar18);
                auVar75[0xe] = -(pgVar1->m[0xe].n == uVar19);
                auVar75[0xf] = -(uVar16 == uVar21);
                local_288 = (Symbol *)CONCAT71(local_288._1_7_,uVar16);
                for (uVar38 = (uint)(ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe);
                    uVar38 != 0; uVar38 = uVar38 - 1 & uVar38) {
                  uVar53 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                    }
                  }
                  uVar47 = (ulong)uVar53;
                  if ((pPVar44 == (PrimitivePortSymbol *)pvVar71[uVar45 * 0xf + uVar47].first._M_len
                      ) && ((pPVar44 == (PrimitivePortSymbol *)0x0 ||
                            (iVar36 = bcmp((void *)uVar29,
                                           pvVar71[uVar45 * 0xf + uVar47].first._M_str,
                                           (size_t)pPVar44), iVar36 == 0)))) {
                    pPVar44 = pvVar71[uVar45 * 0xf + uVar47].second;
                    uStack_210._4_1_ = bStack_2cc;
                    uStack_210._0_4_ = uStack_2d0;
                    uStack_210._5_1_ = bStack_2cb;
                    uStack_210._6_2_ = uStack_2ca;
                    port = port_1;
                    if ((pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax !=
                        (SyntaxNode *)0x0) {
                      SVar79 = parsing::Token::range((Token *)&port);
                      pDVar48 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar79);
                      sVar80 = parsing::Token::valueText((Token *)&port);
                      Diagnostic::operator<<(pDVar48,sVar80);
                      Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,
                                          (pPVar44->super_ValueSymbol).super_Symbol.location);
                    }
                    SVar49 = parsing::Token::location((Token *)&port_1);
                    (pPVar44->super_ValueSymbol).super_Symbol.location = SVar49;
                    (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax =
                         (SyntaxNode *)local_f0;
                    syntax_02._M_ptr =
                         (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_ptr;
                    syntax_02._M_extent._M_extent_value =
                         (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_extent._M_extent_value;
                    Symbol::setAttributes((Symbol *)pPVar44,scope,syntax_02);
                    pEVar57 = extraout_RDX_08;
                    goto LAB_0024ba98;
                  }
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar46 & 7] & (byte)local_288)
                    == 0) break;
                pbVar25 = (basic_string_view<char,_std::char_traits<char>_> *)
                          &pVVar70->prefixExpression;
                pVVar70 = (ValueDriver *)
                          ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                  &pVVar70->prefixExpression)->_M_len + 1);
                uVar45 = (ulong)((long)&pbVar25->_M_len + uVar45 + 1) & local_100;
              } while (pVVar70 <= (ulong)local_100);
              sVar80 = parsing::Token::valueText((Token *)&port_1);
              pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
              if (sVar80._M_len != 0) {
                SVar79 = parsing::Token::range((Token *)&port_1);
                pDVar48 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar79);
                sVar80 = parsing::Token::valueText((Token *)&port_1);
                Diagnostic::operator<<(pDVar48,sVar80);
                pEVar57 = extraout_RDX_07;
              }
LAB_0024ba98:
              pVVar58 = (ValueDriver *)((long)&(pVVar58->prefixExpression).ptr + 1);
            } while (pVVar58 != (ValueDriver *)local_f8);
          }
        }
        uVar68 = uVar68 + 1;
      } while (uVar68 != uVar73 >> 1);
      if (local_290 != (UdpInputPortDeclSyntax *)0x0) {
        port_1 = (PrimitivePortSymbol *)
                 (local_290->names).super_SyntaxListBase.super_SyntaxNode.parent;
        pSVar59 = (local_290->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
        uStack_2d0 = (uint)pSVar59;
        bStack_2cc = SUB81((ulong)pSVar59 >> 0x20,0);
        bStack_2cb = SUB81((ulong)pSVar59 >> 0x28,0);
        uStack_2ca = (undefined2)((ulong)pSVar59 >> 0x30);
        _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
        uVar46 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (local_140,(basic_string_view<char,_std::char_traits<char>_> *)&port);
        sVar62 = local_138.groups_size_mask;
        pEVar57 = (EVP_PKEY_CTX *)(uVar46 & 0xff);
        uVar73 = uVar46 >> ((undefined1)local_138.groups_size_index & 0x3f);
        pgVar66 = local_138.groups_;
        lVar64 = (long)pEVar57 * 4;
        uVar17 = (&UNK_0048f58c)[lVar64];
        uVar18 = (&UNK_0048f58d)[lVar64];
        uVar19 = (&UNK_0048f58e)[lVar64];
        uVar21 = (&UNK_0048f58f)[lVar64];
        uVar24 = *(undefined4 *)(&UNK_0048f58c + lVar64);
        ppVar3 = local_138.elements_;
        pPVar44 = port;
        uVar29 = uStack_210;
        inputDecl_1 = (UdpInputPortDeclSyntax *)0x0;
        local_318 = uVar17;
        uStack_317 = uVar18;
        uStack_316 = uVar19;
        uStack_315 = uVar21;
        do {
          pgVar1 = (group_type_pointer)((long)pgVar66 + uVar73 * 0x10);
          auVar78[0] = -(pgVar1->m[0].n == local_318);
          auVar78[1] = -(pgVar1->m[1].n == uStack_317);
          auVar78[2] = -(pgVar1->m[2].n == uStack_316);
          auVar78[3] = -(pgVar1->m[3].n == uStack_315);
          auVar78[4] = -(pgVar1->m[4].n == uVar17);
          auVar78[5] = -(pgVar1->m[5].n == uVar18);
          auVar78[6] = -(pgVar1->m[6].n == uVar19);
          auVar78[7] = -(pgVar1->m[7].n == uVar21);
          auVar78[8] = -(pgVar1->m[8].n == uVar17);
          auVar78[9] = -(pgVar1->m[9].n == uVar18);
          auVar78[10] = -(pgVar1->m[10].n == uVar19);
          auVar78[0xb] = -(pgVar1->m[0xb].n == uVar21);
          auVar78[0xc] = -(pgVar1->m[0xc].n == uVar17);
          auVar78[0xd] = -(pgVar1->m[0xd].n == uVar18);
          auVar78[0xe] = -(pgVar1->m[0xe].n == uVar19);
          auVar78[0xf] = -(pgVar1->m[0xf].n == uVar21);
          uVar38 = (uint)(ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe);
          if (uVar38 != 0) {
            ppVar5 = (value_type_pointer)((long)ppVar3 + uVar73 * 0x168);
            do {
              uVar53 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              if (pPVar44 == (PrimitivePortSymbol *)ppVar5[uVar53].first._M_len) {
                if (pPVar44 != (PrimitivePortSymbol *)0x0) {
                  iVar36 = bcmp((void *)uVar29,ppVar5[uVar53].first._M_str,(size_t)pPVar44);
                  local_318 = (uchar)uVar24;
                  uStack_317 = (uchar)((uint)uVar24 >> 8);
                  uStack_316 = (uchar)((uint)uVar24 >> 0x10);
                  uStack_315 = (uchar)((uint)uVar24 >> 0x18);
                  pEVar57 = extraout_RDX_36;
                  if (iVar36 != 0) goto LAB_0024d3dd;
                }
                pPVar44 = ppVar5[uVar53].second;
                if ((pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0
                   ) {
                  if (pPVar44->direction == In) {
                    SVar79 = parsing::Token::range((Token *)&port_1);
                    pDVar48 = Scope::addDiag(scope,(DiagCode)0xad0006,SVar79);
                    Diagnostic::operator<<(pDVar48,(pPVar44->super_ValueSymbol).super_Symbol.name);
                    pEVar57 = extraout_RDX_38;
                  }
                  else if (pPVar44->direction == OutReg) {
                    uStack_210._4_1_ = bStack_2cc;
                    uStack_210._0_4_ = uStack_2d0;
                    uStack_210._5_1_ = bStack_2cb;
                    uStack_210._6_2_ = uStack_2ca;
                    port = port_1;
                    SVar79 = parsing::Token::range((Token *)&port);
                    pDVar48 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar79);
                    sVar80 = parsing::Token::valueText((Token *)&port);
                    Diagnostic::operator<<(pDVar48,sVar80);
                    Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,
                                        (pPVar44->super_ValueSymbol).super_Symbol.location);
                    pEVar57 = extraout_RDX_37;
                  }
                  else {
                    pPVar44->direction = OutReg;
                  }
                }
                goto LAB_0024c142;
              }
LAB_0024d3dd:
              uVar38 = uVar38 - 1 & uVar38;
            } while (uVar38 != 0);
          }
          pUVar26 = &inputDecl_1->super_UdpPortDeclSyntax;
          inputDecl_1 = (UdpInputPortDeclSyntax *)
                        ((long)&(inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind + 1);
          uVar73 = (long)&(pUVar26->super_SyntaxNode).kind + uVar73 + 1 & sVar62;
        } while( true );
      }
    }
LAB_0024c142:
    ppPVar30 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
    if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len != 0) {
      lVar64 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len << 3;
      lVar61 = 0;
      do {
        lVar10 = *(long *)((long)ppPVar30 + lVar61);
        if ((*(long *)(lVar10 + 0x38) == 0) && (*(long *)(lVar10 + 8) != 0)) {
          pDVar48 = Scope::addDiag(scope,(DiagCode)0xaa0006,*(SourceLocation *)(lVar10 + 0x18));
          Diagnostic::operator<<(pDVar48,*(string_view *)(lVar10 + 8));
          pEVar57 = extraout_RDX_16;
        }
        lVar61 = lVar61 + 8;
      } while (lVar64 != lVar61);
    }
    port = (PrimitivePortSymbol *)local_140;
    if (local_138.elements_ !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
         *)0x0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
                    *)&port,local_138.elements_,(local_138.groups_size_mask * 0x178 + 0x186) / 0x18)
      ;
      pEVar57 = extraout_RDX_17;
    }
  }
  else {
    if (pSVar59->kind != AnsiUdpPortList) goto LAB_0024d217;
    pbVar42 = (byte *)((long)&(pSVar59[3].previewNode)->kind + 1);
    if ((byte *)0x1 < pbVar42) {
      this_02 = &(this_00->super_ValueSymbol).declaredType;
      uVar73 = 0;
      do {
        ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (pSVar59[3].parent + uVar73 * 2));
        pSVar7 = *ppSVar43;
        if (pSVar7->kind == UdpOutputPortDecl) {
          conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_._0_4_ =
               2 - (uint)(pSVar7[4].parent == (SyntaxNode *)0x0);
          name = (Token)parsing::Token::valueText((Token *)&pSVar7[4].previewNode);
          port_1 = (PrimitivePortSymbol *)parsing::Token::location((Token *)&pSVar7[4].previewNode);
          pPVar44 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                              (&pCVar6->super_BumpAllocator,pCVar6,
                               (basic_string_view<char,_std::char_traits<char>_> *)&name,
                               (SourceLocation *)&port_1,(PrimitivePortDirection *)&conflicts);
          port = pPVar44;
          (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax = pSVar7;
          Symbol::setAttributes
                    ((Symbol *)pPVar44,scope,
                     *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                       *)&pSVar7[2].previewNode);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port);
          Scope::insertMember((Scope *)this_02,(Symbol *)port,
                              (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,false,
                              true);
          pEVar57 = extraout_RDX_03;
        }
        else {
          pEVar57 = extraout_RDX_02;
          if (1 < *(long *)(pSVar7 + 6) + 1U) {
            uVar68 = *(long *)(pSVar7 + 6) + 1U >> 1;
            lVar64 = 0;
            do {
              ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((long)&(pSVar7[5].previewNode)->kind + lVar64));
              pSVar8 = *ppSVar43;
              name = *(Token *)(pSVar8 + 1);
              _port = (undefined1  [16])parsing::Token::valueText(&name);
              SVar49 = parsing::Token::location(&name);
              conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
                   (pointer)SVar49;
              port_2 = (PrimitivePortSymbol *)((ulong)port_2 & 0xffffffff00000000);
              port_1 = BumpAllocator::
                       emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                 (&pCVar6->super_BumpAllocator,pCVar6,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&port,
                                  (SourceLocation *)&conflicts,(PrimitivePortDirection *)&port_2);
              (port_1->super_ValueSymbol).super_Symbol.originatingSyntax = pSVar8;
              Symbol::setAttributes
                        ((Symbol *)port_1,scope,
                         *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                           *)&pSVar7[2].previewNode);
              SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
              emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                        ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_1);
              Scope::insertMember((Scope *)this_02,(Symbol *)port_1,
                                  (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,
                                  false,true);
              lVar64 = lVar64 + 0x30;
              uVar68 = uVar68 - 1;
              pEVar57 = extraout_RDX_04;
            } while (uVar68 != 0);
          }
        }
        uVar73 = uVar73 + 1;
      } while (uVar73 != (ulong)pbVar42 >> 1);
    }
    pUVar9 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_200._48_8_ + 0x78))->ptr;
    if ((pUVar9->portDecls).elements._M_extent._M_extent_value != 0) {
      ppSVar43 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pUVar9->portDecls).elements._M_ptr);
      SVar79 = slang::syntax::SyntaxNode::sourceRange(*ppSVar43);
      Scope::addDiag(scope,(DiagCode)0xa20006,SVar79);
      pEVar57 = extraout_RDX_05;
    }
  }
  iVar36 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                      (EVP_PKEY_CTX *)pCVar6,pEVar57);
  ((span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> *)
  &(this_00->super_ValueSymbol).declaredType.flags)->_M_ptr = (pointer)CONCAT44(extraout_var,iVar36)
  ;
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[0].left = extraout_RDX_18;
  code.subsystem = Declarations;
  code.code = 0xae;
  pPVar44 = this_00;
  if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len < 2) {
LAB_0024c24d:
    Scope::addDiag(scope,code,(pPVar44->super_ValueSymbol).super_Symbol.location);
    goto LAB_0024d217;
  }
  pPVar44 = *ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
  if (pPVar44->direction == OutReg) {
    *(undefined1 *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x20) = 1;
    pSVar59 = (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax;
    if (((pSVar59 == (SyntaxNode *)0x0) || (pSVar59->kind != UdpOutputPortDecl)) ||
       (pSVar59[5].parent == (SyntaxNode *)0x0)) goto LAB_0024c28d;
    pSVar59 = pSVar59[5].parent[1].previewNode;
  }
  else {
    code.subsystem = Declarations;
    code.code = 0xa7;
    if (pPVar44->direction == In) goto LAB_0024c24d;
LAB_0024c28d:
    pSVar59 = (SyntaxNode *)0x0;
  }
  sVar56 = 1;
  do {
    if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_[sVar56]->
        direction != In) {
      Scope::addDiag(scope,(DiagCode)0xa40006,
                     (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_
                      [sVar56]->super_ValueSymbol).super_Symbol.location);
      break;
    }
    sVar56 = sVar56 + 1;
  } while (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len != sVar56);
  this = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_200._48_8_ + 0x78))->ptr->initialStmt;
  if (this == (UdpInitialStmtSyntax *)0x0) {
LAB_0024c359:
    if (pSVar59 != (SyntaxNode *)0x0) goto LAB_0024c362;
  }
  else {
    if (*(char *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x20) == '\0') {
      SVar79 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      Scope::addDiag(scope,(DiagCode)0xa60006,SVar79);
      goto LAB_0024c359;
    }
    if (pSVar59 == (SyntaxNode *)0x0) {
      pSVar59 = &((this->value).ptr)->super_SyntaxNode;
      sVar80 = parsing::Token::valueText(&this->name);
      sVar52 = sVar80._M_len;
      if (sVar52 != 0) {
        sVar13 = ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_)->
                 super_ValueSymbol).super_Symbol.name._M_len;
        if (sVar13 != 0) {
          if (sVar52 == sVar13) {
            iVar36 = bcmp(sVar80._M_str,
                          ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.
                             data_)->super_ValueSymbol).super_Symbol.name._M_str,sVar52);
            if (iVar36 == 0) goto LAB_0024c359;
          }
          SVar79 = parsing::Token::range(&this->name);
          pDVar48 = Scope::addDiag(scope,(DiagCode)0xaf0006,SVar79);
          Diagnostic::operator<<(pDVar48,sVar80);
          Diagnostic::addNote(pDVar48,(DiagCode)0x50001,
                              ((*ports.
                                 super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.
                                 data_)->super_ValueSymbol).super_Symbol.location);
        }
      }
      goto LAB_0024c359;
    }
    SVar79 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
    pDVar48 = Scope::addDiag(scope,(DiagCode)0xa30006,SVar79);
    name = slang::syntax::SyntaxNode::getFirstToken(pSVar59);
    SVar49 = parsing::Token::location(&name);
    Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,SVar49);
LAB_0024c362:
    name.info._0_4_ = 0xffffffff;
    name._0_8_ = scope;
    iVar36 = Expression::bind((int)pSVar59,(sockaddr *)&name,0);
    pEVar50 = (Expression *)CONCAT44(extraout_var_00,iVar36);
    bVar31 = Expression::bad(pEVar50);
    if (!bVar31) {
      if ((pEVar50->kind == IntegerLiteral) &&
         ((bVar37 = Type::getBitWidth((pEVar50->type).ptr), bVar37 == 1 ||
          (bVar31 = Expression::isUnsizedInteger(pEVar50), bVar31)))) {
        ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)&name,pEVar50,
                         (bitmask<slang::ast::EvalFlags>)0x0);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        if (&pEVar50->constant->value !=
            (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             *)0x0) {
          this_01 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (&pEVar50->constant->value);
          _port = ZEXT814(0) << 0x30;
          auVar23 = _port;
          auVar22._8_4_ = 0;
          auVar22._0_8_ = uStack_210;
          _port = auVar22 << 0x40;
          uStack_210._5_3_ = auVar23._13_3_;
          uStack_210._4_1_ = 1;
          _port = ZEXT412(1) << 0x40;
          SVInt::clearUnusedBits((SVInt *)&port);
          lVar32 = SVInt::operator==(this_01,(SVInt *)&port);
          bStack_2cb = false;
          port_1 = (PrimitivePortSymbol *)0x1;
          bStack_2cc = true;
          uStack_2d0 = 2;
          SVInt::clearUnusedBits((SVInt *)&port_1);
          lVar33 = SVInt::operator==(this_01,(SVInt *)&port_1);
          bVar31 = false;
          cVar67 = -0x80;
          if (lVar33.value == '\0' && lVar32.value == '\0') {
            cVar67 = '\0';
          }
          if (lVar33.value == '\x01') {
            cVar67 = '\x01';
          }
          if (lVar32.value == '\x01') {
            cVar67 = '\x01';
          }
          if ((this_01->super_SVIntStorage).bitWidth == 1) {
            lVar32 = SVInt::operator[](this_01,0);
            bVar31 = lVar32.value == 0x80;
          }
          if (((0x40 < uStack_2d0) || ((bStack_2cb & 1U) != 0)) &&
             (port_1 != (PrimitivePortSymbol *)0x0)) {
            operator_delete__(port_1);
          }
          if (((0x40 < (uint)(undefined4)uStack_210) ||
              ((_port & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0)) &&
             (port != (PrimitivePortSymbol *)0x0)) {
            operator_delete__(port);
          }
          if (bVar31 || cVar67 != '\0' && (cVar67 != '@' && cVar67 != -0x80)) {
            (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
            .first[1].right = (unsigned_long)pEVar50->constant;
          }
        }
      }
      if ((this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
          .first[1].right == 0) {
        Scope::addDiag(scope,(DiagCode)0xa50006,pEVar50->sourceRange);
      }
    }
  }
  name.kind = Unknown;
  name._2_1_ = 0;
  name.numFlags.raw = '\0';
  name.rawLen = 0;
  name.info = (Info *)0x0;
  BumpAllocator::BumpAllocator(&alloc);
  trieAlloc.freeList = (FreeNode *)0x0;
  uStack_210 = 0;
  port = (PrimitivePortSymbol *)local_200;
  local_208 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
               *)0x2;
  pUVar9 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_200._48_8_ + 0x78))->ptr;
  sVar62 = (pUVar9->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
           _M_extent._M_extent_value;
  pEVar57 = extraout_RDX_19;
  trieAlloc.alloc = &alloc;
  if (sVar62 != 0) {
    pvVar71 = (value_type *)
              (pUVar9->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
              _M_ptr;
    local_288 = (Symbol *)(&(pvVar71->first)._M_len + sVar62);
    do {
      sVar56 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
      syntax_00 = (UdpEntrySyntax *)(pvVar71->first)._M_len;
      port_1 = (PrimitivePortSymbol *)(local_2c8 + 8);
      uStack_2d0 = 0;
      bStack_2cc = false;
      bStack_2cb = false;
      uStack_2ca = 0;
      local_2c8._0_8_ = 0x28;
      sVar62 = (syntax_00->inputs).
               super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_extent.
               _M_extent_value;
      elements = pvVar71;
      if (sVar62 == 0) {
        bVar35 = 1;
        elements_1 = (value_type *)0x0;
        bVar31 = false;
      }
      else {
        ppUVar74 = (syntax_00->inputs).
                   super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_ptr;
        ppUVar4 = ppUVar74 + sVar62;
        bVar35 = 1;
        elements_1 = (value_type *)0x0;
        bVar31 = false;
        do {
          pUVar11 = *ppUVar74;
          if ((pUVar11->super_SyntaxNode).kind == UdpEdgeField) {
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_._0_1_ =
                 0x28;
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)&port_1,(char *)&conflicts);
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len = 0;
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
                 (pointer)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                          firstElement;
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.cap = 0x28;
            sVar80 = parsing::Token::rawText((Token *)&pUVar11[1].super_SyntaxNode.previewNode);
            if (sVar80._M_len != 0) {
              sVar62 = 0;
              do {
                iVar36 = tolower((int)sVar80._M_str[sVar62]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)iVar36);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&conflicts,(char *)&port_2);
                sVar62 = sVar62 + 1;
              } while (sVar80._M_len != sVar62);
            }
            sVar80 = parsing::Token::rawText((Token *)&pUVar11[2].super_SyntaxNode.parent);
            pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
            if (sVar80._M_len != 0) {
              sVar62 = 0;
              do {
                iVar36 = tolower((int)(char)((EVP_PKEY_CTX *)sVar80._M_str)[sVar62]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)iVar36);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&conflicts,(char *)&port_2);
                sVar62 = sVar62 + 1;
                pEVar57 = extraout_RDX_20;
              } while (sVar80._M_len != sVar62);
            }
            sVar28 = conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len;
            if (conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len == 2) {
              if (*(char *)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                           data_ == '?') {
                if (*(char *)((long)conflicts.
                                    super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                                    data_ + 1) == 'x') {
                  port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x62);
                  SmallVectorBase<char>::emplace_back<char>
                            ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                  port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x78);
                  SmallVectorBase<char>::emplace_back<char>
                            ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                  goto LAB_0024c885;
                }
LAB_0024c88a:
                SmallVectorBase<char>::emplace_back<char_const&>
                          ((SmallVectorBase<char> *)&port_1,
                           (char *)conflicts.
                                   super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                                   data_);
                SmallVectorBase<char>::emplace_back<char_const&>
                          ((SmallVectorBase<char> *)&port_1,
                           (char *)((long)conflicts.
                                          super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>
                                          .data_ + 1));
                bVar35 = (*(char *)((long)conflicts.
                                          super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>
                                          .data_ + 1) == 'x' &&
                         *(char *)conflicts.
                                  super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_
                         == 'x') & bVar35;
              }
              else {
                if ((*(char *)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>
                              .data_ != 'x') ||
                   (*(char *)((long)conflicts.
                                    super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                                    data_ + 1) != '?')) goto LAB_0024c88a;
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x78);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x62);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
LAB_0024c885:
                bVar35 = 0;
              }
              port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x29);
              SmallVectorBase<char>::emplace_back<char>
                        ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
              elements_1 = (value_type *)((long)&(elements_1->first)._M_len + 1);
              pEVar57 = extraout_RDX_22;
            }
            if (conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ !=
                (pointer)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                         firstElement) {
              operator_delete(conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>
                              .data_);
              pEVar57 = extraout_RDX_23;
            }
            bVar31 = true;
            if (sVar28 != 2) goto LAB_0024cca5;
          }
          else {
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_._0_4_ =
                 pUVar11[1].super_SyntaxNode.kind;
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_._4_4_ =
                 *(undefined4 *)&pUVar11[1].super_SyntaxNode.field_0x4;
            conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len =
                 (size_type)pUVar11[1].super_SyntaxNode.parent;
            sVar80 = parsing::Token::rawText((Token *)&conflicts);
            sVar62 = sVar80._M_len;
            pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
            if (sVar62 != 0) {
              elements_1 = (value_type *)((long)&(elements_1->first)._M_len + sVar62);
              sVar63 = 0;
              do {
                uVar53 = tolower((int)(char)((EVP_PKEY_CTX *)sVar80._M_str)[sVar63]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)uVar53);
                uVar38 = (uVar53 & 0xff) - 0x66;
                if (((uVar38 < 0xd) && ((0x1501U >> (uVar38 & 0x1f) & 1) != 0)) ||
                   ((uVar53 & 0xff) == 0x2a)) {
                  bVar31 = true;
                }
                SmallVectorBase<char>::emplace_back<char_const&>
                          ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                bVar35 = bVar35 & (char)port_2 == 'x';
                sVar63 = sVar63 + 1;
                pEVar57 = extraout_RDX_21;
              } while (sVar62 != sVar63);
            }
          }
          ppUVar74 = ppUVar74 + 1;
        } while (ppUVar74 != ppUVar4);
      }
      if ((sVar56 < 2) || (pvVar71 = (value_type *)(sVar56 - 1), elements_1 == pvVar71)) {
        pUVar11 = syntax_00->current;
        if (pUVar11 == (UdpFieldBaseSyntax *)0x0) {
          uVar38 = 0;
LAB_0024c99c:
          pUVar11 = syntax_00->next;
          if ((pUVar11 != (UdpFieldBaseSyntax *)0x0) &&
             ((pUVar11->super_SyntaxNode).kind == UdpSimpleField)) {
            sVar80 = parsing::Token::rawText((Token *)(pUVar11 + 1));
            pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
            if (sVar80._M_len == 1) {
              uVar53 = tolower((int)(char)*pEVar57);
              uVar39 = uVar53 & 0xff;
              bVar34 = (byte)uVar53;
              if (((bVar34 < 0x32) && ((0x3200000000000U >> ((ulong)uVar39 & 0x3f) & 1) != 0)) ||
                 (pEVar57 = extraout_RDX_25, uVar39 == 0x78)) {
                conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len = 0;
                conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
                     (pointer)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>
                              .firstElement;
                conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.cap = 5;
                inputs._M_extent._M_extent_value._0_4_ = uStack_2d0;
                inputs._M_ptr = (pointer)port_1;
                inputs._M_extent._M_extent_value._4_1_ = bStack_2cc;
                inputs._M_extent._M_extent_value._5_1_ = bStack_2cb;
                inputs._M_extent._M_extent_value._6_2_ = uStack_2ca;
                bVar69 = (byte)uVar38;
                BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
                          ((BitTrie *)&name,syntax_00,inputs,bVar69,&trieAlloc,&conflicts);
                pEVar57 = extraout_RDX_26;
                if (conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len == 0)
                {
                  if ((bool)(~bVar35 & 1) || bVar34 == 0x78) goto LAB_0024cd49;
                  SVar79 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
                  Scope::addDiag(scope,(DiagCode)0xca0006,SVar79);
                  pEVar57 = extraout_RDX_30;
                }
                else {
                  ppUVar27 = conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                             data_;
                  lVar64 = conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                           len << 3;
                  lVar61 = 0;
                  do {
                    sVar14._M_str = (char *)pEVar57;
                    sVar14._M_len = (size_t)ppUVar27;
                    sVar80._M_str = (char *)pEVar57;
                    sVar80._M_len = (size_t)ppUVar27;
                    pSVar59 = *(SyntaxNode **)((long)ppUVar27 + lVar61);
                    piVar12 = *(int **)(pSVar59 + 5);
                    if ((piVar12 == (int *)0x0) || (sVar80 = sVar14, *piVar12 != 0x1e5)) {
LAB_0024cb09:
                      uVar53 = 0;
                      sVar81 = sVar80;
                    }
                    else {
                      sVar80 = parsing::Token::rawText((Token *)(piVar12 + 6));
                      if (sVar80._M_len != 1) goto LAB_0024cb09;
                      uVar53 = tolower((int)*sVar80._M_str);
                      uVar73 = (ulong)uVar53 & 0xff;
                      sVar15._M_str = extraout_RDX_27;
                      sVar15._M_len = uVar73;
                      sVar81._M_str = extraout_RDX_27;
                      sVar81._M_len = uVar73;
                      sVar80._M_str = extraout_RDX_27;
                      sVar80._M_len = uVar73;
                      if (((0x31 < (byte)uVar53) ||
                          ((0x3200000000000U >> ((ulong)uVar53 & 0x3f) & 1) == 0)) &&
                         (sVar81 = sVar15, (int)uVar73 != 0x78)) goto LAB_0024cb09;
                    }
                    piVar12 = *(int **)(pSVar59 + 4);
                    if ((piVar12 == (int *)0x0) || (*piVar12 != 0x1e5)) {
LAB_0024cb68:
                      pEVar57 = (EVP_PKEY_CTX *)sVar81._M_str;
                      bVar35 = 0;
                    }
                    else {
                      sVar81 = parsing::Token::rawText((Token *)(piVar12 + 6));
                      if (sVar81._M_len != 1) goto LAB_0024cb68;
                      uVar40 = tolower((int)*sVar81._M_str);
                      bVar35 = (byte)uVar40;
                      uVar54 = (uVar40 & 0xff) - 0x3f;
                      pEVar57 = (EVP_PKEY_CTX *)(ulong)uVar54;
                      sVar81 = (string_view)(ZEXT416(uVar54) << 0x40);
                      if (((0x39 < uVar54) ||
                          ((0x200000800000001U >> ((ulong)pEVar57 & 0x3f) & 1) == 0)) &&
                         (1 < (uVar40 & 0xff) - 0x30)) goto LAB_0024cb68;
                    }
                    bVar72 = (byte)uVar53;
                    if (bVar72 == bVar34) goto LAB_0024cc38;
                    if (bVar72 == 0x2d) {
                      if (0x61 < bVar35) {
                        if (bVar35 == 0x78) goto LAB_0024cbce;
                        if ((bVar35 == 0x62) && ((bVar34 & 0xfe) == 0x30)) goto LAB_0024cc38;
                        goto LAB_0024cbd4;
                      }
                      pEVar57 = (EVP_PKEY_CTX *)(ulong)(bVar35 - 0x30);
                      if (bVar35 - 0x30 < 2) {
LAB_0024cbce:
                        if (bVar35 != bVar34) goto LAB_0024cbd4;
                        goto LAB_0024cc38;
                      }
                      if (bVar35 != 0x3f) goto LAB_0024cbd4;
                      if (uVar39 - 0x30 < 2) goto LAB_0024cc38;
                      if (uVar39 == 0x2d) goto LAB_0024cbdf;
                      if (uVar39 == 0x78) goto LAB_0024cc38;
LAB_0024cd89:
                      SVar79 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
                      pDVar48 = Scope::addDiag(scope,(DiagCode)0xcb0006,SVar79);
                      SVar79 = slang::syntax::SyntaxNode::sourceRange(pSVar59);
                      Diagnostic::addNote(pDVar48,(DiagCode)0xa0001,SVar79);
                      pEVar57 = extraout_RDX_33;
                      goto LAB_0024cdc6;
                    }
LAB_0024cbd4:
                    if (bVar34 != 0x2d) goto LAB_0024cd89;
LAB_0024cbdf:
                    if (0x61 < bVar69) {
                      if (bVar69 == 0x78) goto LAB_0024cc2d;
                      if (((uVar38 & 0xff) == 0x62) && ((bVar72 & 0xfe) == 0x30)) goto LAB_0024cc38;
                      goto LAB_0024cd89;
                    }
                    if ((uVar38 & 0xff) - 0x30 < 2) {
LAB_0024cc2d:
                      if (bVar72 != bVar69) goto LAB_0024cd89;
                    }
                    else if (((uVar38 & 0xff) != 0x3f) ||
                            ((1 < (uVar53 & 0xff) - 0x30 && ((uVar53 & 0xff) != 0x78))))
                    goto LAB_0024cd89;
LAB_0024cc38:
                    lVar61 = lVar61 + 8;
                  } while (lVar64 != lVar61);
LAB_0024cd49:
                  iVar36 = SmallVectorBase<char>::copy
                                     ((SmallVectorBase<char> *)&port_1,
                                      (EVP_PKEY_CTX *)scope->compilation,pEVar57);
                  local_2f0 = (char *)CONCAT44(extraout_var_01,iVar36);
                  port_2 = extraout_RDX_31;
                  local_2e8._M_local_buf[0] = bVar69;
                  local_2e8._M_allocated_capacity._1_1_ = bVar34;
                  local_2e8._M_local_buf[2] = bVar31;
                  SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
                  emplace_back<slang::ast::PrimitiveSymbol::TableEntry>
                            ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&port,
                             (TableEntry *)&port_2);
                  pEVar57 = extraout_RDX_32;
                }
LAB_0024cdc6:
                if (conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ !=
                    (pointer)conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                             firstElement) {
                  operator_delete(conflicts.
                                  super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_
                                 );
                  pEVar57 = extraout_RDX_34;
                }
              }
            }
          }
        }
        else if ((pUVar11->super_SyntaxNode).kind == UdpSimpleField) {
          sVar80 = parsing::Token::rawText((Token *)(pUVar11 + 1));
          pEVar57 = (EVP_PKEY_CTX *)sVar80._M_str;
          if (sVar80._M_len == 1) {
            uVar38 = tolower((int)(char)*pEVar57);
            uVar53 = (uVar38 & 0xff) - 0x3f;
            pEVar57 = extraout_RDX_24;
            if (((uVar53 < 0x3a) &&
                (pEVar57 = (EVP_PKEY_CTX *)0x200000800000001,
                (0x200000800000001U >> ((ulong)uVar53 & 0x3f) & 1) != 0)) ||
               ((uVar38 & 0xff) - 0x30 < 2)) goto LAB_0024c99c;
          }
        }
      }
      else {
        SVar79 = slang::syntax::SyntaxNode::sourceRange
                           (&(syntax_00->inputs).super_SyntaxListBase.super_SyntaxNode);
        pDVar48 = Scope::addDiag(scope,(DiagCode)0xcc0006,SVar79);
        conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
             (pointer)elements_1;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar48->args,(unsigned_long *)&conflicts);
        conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
             (pointer)pvVar71;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar48->args,(unsigned_long *)&conflicts);
        pEVar57 = extraout_RDX_28;
      }
LAB_0024cca5:
      if (port_1 != (PrimitivePortSymbol *)(local_2c8 + 8)) {
        operator_delete(port_1);
        pEVar57 = extraout_RDX_29;
      }
      if (((Info *)uStack_210 != (Info *)0x0) &&
         (*(char *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21) == '\0')) {
        *(undefined1 *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21) =
             *(undefined1 *)((long)port + uStack_210 * 0x18 + -6);
      }
      pvVar71 = (value_type *)&(elements->first)._M_str;
    } while ((Symbol *)pvVar71 != local_288);
  }
  iVar36 = SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::copy
                     ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&port,
                      (EVP_PKEY_CTX *)pCVar6,pEVar57);
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[0].right = CONCAT44(extraout_var_02,iVar36);
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[1].left = extraout_RDX_35;
  if ((extraout_RDX_35 != 0 &
      *(byte *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21)) == 1) {
    sVar62 = (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             .first[0].left;
    port_1 = (PrimitivePortSymbol *)local_2c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&port_1,AllPrimEdges[1],*AllPrimEdges + AllPrimEdges[1]);
    sVar60 = sVar62 - 2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
               CONCAT26(uStack_2ca,CONCAT15(bStack_2cb,CONCAT14(bStack_2cc,uStack_2d0))),0,sVar60,
               '0');
    conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ =
         (pointer)&conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.cap;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conflicts,
               sVar60,'x');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conflicts,
               "(x1)",4);
    port_2 = (PrimitivePortSymbol *)&local_2e8;
    local_2f0 = (char *)0x0;
    local_2e8._M_local_buf[0] = 0;
    pCVar6 = scope->compilation;
    inputDecl_1 = (UdpInputPortDeclSyntax *)0x0;
    uVar38 = 0;
LAB_0024cefc:
    inputs_00._M_extent._M_extent_value._0_4_ = uStack_2d0;
    inputs_00._M_ptr = (pointer)port_1;
    inputs_00._M_extent._M_extent_value._4_1_ = bStack_2cc;
    inputs_00._M_extent._M_extent_value._5_1_ = bStack_2cb;
    inputs_00._M_extent._M_extent_value._6_2_ = uStack_2ca;
    bVar31 = BitTrie::contains((BitTrie *)&name,inputs_00,'?');
    if (!bVar31) {
      if (inputDecl_1 == (UdpInputPortDeclSyntax *)0x0) {
        inputDecl_1 = (UdpInputPortDeclSyntax *)
                      Scope::addDiag(scope,(DiagCode)0xfa0006,
                                     (this_00->super_ValueSymbol).super_Symbol.location);
      }
      pPVar44 = port_1;
      if ((pCVar6->options).maxUDPCoverageNotes <= uVar38) goto LAB_0024d141;
      lVar64 = CONCAT26(uStack_2ca,CONCAT15(bStack_2cb,CONCAT14(bStack_2cc,uStack_2d0)));
      if (lVar64 != 0) {
        bVar31 = true;
        lVar61 = 0;
        do {
          cVar67 = *(char *)((long)&(pPVar44->super_ValueSymbol).super_Symbol.kind + lVar61);
          if (cVar67 == '(') {
            bVar31 = false;
          }
          else if (cVar67 == ')') {
            bVar31 = true;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
                     cVar67);
          if (bVar31) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
                      ' ');
          }
          lVar61 = lVar61 + 1;
        } while (lVar64 != lVar61);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,'\n');
      uVar38 = uVar38 + 1;
    }
    sVar52 = CONCAT26(uStack_2ca,CONCAT15(bStack_2cb,CONCAT14(bStack_2cc,uStack_2d0)));
    if ((*(char *)((long)port_1 + (sVar52 - 1)) != ')') ||
       (sVar52 != conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.len))
    goto LAB_0024d016;
    if (sVar52 != 0) {
      iVar36 = bcmp(port_1,conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.
                           data_,sVar52);
      if (iVar36 == 0) goto LAB_0024d137;
      goto LAB_0024d01f;
    }
LAB_0024d137:
    if (inputDecl_1 == (UdpInputPortDeclSyntax *)0x0) goto LAB_0024d18a;
    goto LAB_0024d152;
  }
  goto LAB_0024d1f0;
LAB_0024d016:
  if (sVar52 != 0) {
LAB_0024d01f:
    sVar60 = 0;
    do {
      pVVar58 = (ValueDriver *)((long)&(port_1->super_ValueSymbol).super_Symbol.kind + sVar60);
      cVar67 = *(char *)((long)&(port_1->super_ValueSymbol).super_Symbol.kind + sVar60);
      if (cVar67 == '(') {
        local_1c8._0_8_ = (ValueDriver *)0x4;
        local_1c8._8_8_ = pVVar58;
        if ((*(long *)(DAT_005f4c70 + -0x10) != 4) ||
           (*(int *)&(pVVar58->prefixExpression).ptr != **(int **)(DAT_005f4c70 + -8))) {
          _Var51 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                             (AllPrimEdges,DAT_005f4c70,local_1c8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                     sVar60,4,_Var51._M_current[1]._M_str,_Var51._M_current[1]._M_len);
          break;
        }
        if (*(char *)((long)port_1 + (sVar52 - 1)) == 'x') {
          if (0 < (long)sVar52) {
            memset(port_1,0x30,sVar52);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                     sVar60 + 1,4,(char *)AllPrimEdges[1],*AllPrimEdges);
          break;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                   sVar60,4,(char *)AllPrimEdges[1],*AllPrimEdges);
        sVar60 = sVar60 + 3;
      }
      else {
        if (cVar67 == '0') {
          *(undefined1 *)&(pVVar58->prefixExpression).ptr = 0x31;
          break;
        }
        if (cVar67 == '1') {
          *(undefined1 *)&(pVVar58->prefixExpression).ptr = 0x78;
          break;
        }
        *(undefined1 *)&(pVVar58->prefixExpression).ptr = 0x30;
      }
      sVar60 = sVar60 + 1;
      sVar52 = CONCAT26(uStack_2ca,CONCAT15(bStack_2cb,CONCAT14(bStack_2cc,uStack_2d0)));
    } while (sVar60 < sVar52);
  }
  goto LAB_0024cefc;
LAB_0024d141:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
             "...and more\n");
LAB_0024d152:
  if (local_2f0 != (char *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2);
    pDVar48 = Diagnostic::addNote((Diagnostic *)inputDecl_1,(DiagCode)0xe70006,
                                  (SourceLocation)0xffffffffffffffff);
    Diagnostic::operator<<(pDVar48,(string *)&port_2);
  }
LAB_0024d18a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)port_2 != &local_2e8) {
    operator_delete(port_2,CONCAT53(local_2e8._M_allocated_capacity._3_5_,
                                    CONCAT12(local_2e8._M_local_buf[2],
                                             CONCAT11(local_2e8._M_local_buf[1],
                                                      local_2e8._M_local_buf[0]))) + 1);
  }
  if (conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_ !=
      (pointer)&conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.cap) {
    operator_delete(conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.data_,
                    conflicts.super_SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>.cap + 1);
  }
  if (port_1 != (PrimitivePortSymbol *)local_2c8) {
    operator_delete(port_1,local_2c8._0_8_ + 1);
  }
LAB_0024d1f0:
  if (port != (PrimitivePortSymbol *)local_200) {
    operator_delete(port);
  }
  BumpAllocator::~BumpAllocator(&alloc);
LAB_0024d217:
  if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ !=
      (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement) {
    operator_delete(ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_);
  }
  return (PrimitiveSymbol *)this_00;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto primName = syntax.name.valueText();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, primName, syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    auto portList = syntax.portList.get();
    if (portList->kind == SyntaxKind::WildcardUdpPortList) {
        auto externPrim = comp.getExternDefinition(primName, scope);
        if (!externPrim || externPrim->kind != SyntaxKind::ExternUdpDecl)
            scope.addDiag(diag::MissingExternWildcardPorts, portList->sourceRange()) << primName;
        else
            portList = externPrim->as<ExternUdpDeclSyntax>().portList;
    }

    SmallVector<const PrimitivePortSymbol*> ports;
    if (portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<std::string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                auto name = outputDecl.name;
                if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else if (!name.valueText().empty()) {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                    diag << name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else if (!name.valueText().empty()) {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            SLANG_ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax() && !port->name.empty()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else {
        // This is an error condition (wildcard port list without a
        // corresponding extern decl). The error has already been
        // issued so just get out of here.
        return *prim;
    }

    prim->ports = ports.copy(comp);
    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }

        BitTrie trie;
        BumpAllocator alloc;
        PoolAllocator<BitTrie> trieAlloc(alloc);
        SmallVector<TableEntry> table;
        for (auto entry : syntax.body->entries) {
            createTableRow(scope, *entry, table, ports.size(), trie, trieAlloc);
            if (!table.empty() && !prim->isEdgeSensitive)
                prim->isEdgeSensitive = table.back().isEdgeSensitive;
        }

        prim->table = table.copy(comp);
        checkPrimitiveEdgeCombinations(*prim, scope, trie);
    }

    return *prim;
}